

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_column_reader.cpp
# Opt level: O2

double duckdb::ParquetDecimalUtils::ReadDecimalValue<double>
                 (const_data_ptr_t pointer,idx_t size,ParquetColumnSchema *schema_ele)

{
  data_t dVar1;
  byte *pbVar2;
  ulong uVar3;
  idx_t iVar4;
  ulong uVar5;
  long lVar6;
  double dVar7;
  uint64_t input;
  double local_28;
  undefined8 uStack_20;
  
  dVar1 = *pointer;
  local_28 = 0.0;
  uVar3 = 0;
  iVar4 = size;
  while( true ) {
    uVar5 = 8;
    if (iVar4 < 8) {
      uVar5 = iVar4;
    }
    if (size <= uVar3) break;
    input = 0;
    pbVar2 = pointer;
    for (lVar6 = 0; -lVar6 != uVar5; lVar6 = lVar6 + -1) {
      *(byte *)((long)&input + lVar6 + 7) = *pbVar2 ^ (char)dVar1 >> 7;
      pbVar2 = pbVar2 + 1;
    }
    local_28 = local_28 * 1.8446744073709552e+19 + 0.0;
    uVar3 = uVar3 + 8;
    iVar4 = iVar4 - 8;
    pointer = pointer + 8;
  }
  if ((char)dVar1 < '\0') {
    local_28 = local_28 + 1.0;
    uStack_20 = 0;
    dVar7 = pow(10.0,(double)schema_ele->type_scale);
    local_28 = -local_28;
  }
  else {
    uStack_20 = 0;
    dVar7 = pow(10.0,(double)schema_ele->type_scale);
  }
  return local_28 / dVar7;
}

Assistant:

double ParquetDecimalUtils::ReadDecimalValue(const_data_ptr_t pointer, idx_t size,
                                             const ParquetColumnSchema &schema_ele) {
	double res = 0;
	bool positive = (*pointer & 0x80) == 0;
	for (idx_t i = 0; i < size; i += 8) {
		auto byte_size = MinValue<idx_t>(sizeof(uint64_t), size - i);
		uint64_t input = 0;
		auto res_ptr = reinterpret_cast<uint8_t *>(&input);
		for (idx_t k = 0; k < byte_size; k++) {
			auto byte = pointer[i + k];
			res_ptr[sizeof(uint64_t) - k - 1] = positive ? byte : byte ^ 0xFF;
		}
		res *= double(NumericLimits<uint64_t>::Maximum()) + 1;
		res += static_cast<double>(input);
	}
	if (!positive) {
		res += 1;
		res /= pow(10, schema_ele.type_scale);
		return -res;
	}
	res /= pow(10, schema_ele.type_scale);
	return res;
}